

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

bool duckdb::FileSystem::HasGlob(string *str)

{
  idx_t i;
  ulong uVar1;
  uint uVar2;
  
  uVar1 = 0;
  while ((str->_M_string_length != uVar1 &&
         ((uVar2 = (byte)(str->_M_dataplus)._M_p[uVar1] - 0x2a, 0x31 < uVar2 ||
          ((0x2000000200001U >> ((ulong)uVar2 & 0x3f) & 1) == 0))))) {
    uVar1 = uVar1 + 1;
  }
  return uVar1 < str->_M_string_length;
}

Assistant:

bool FileSystem::HasGlob(const string &str) {
	for (idx_t i = 0; i < str.size(); i++) {
		switch (str[i]) {
		case '*':
		case '?':
		case '[':
			return true;
		default:
			break;
		}
	}
	return false;
}